

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

void __thiscall
Apple::II::Video::VideoBase::output_double_low_resolution
          (VideoBase *this,uint8_t *target,uint8_t *source,uint8_t *auxiliary_source,size_t length,
          int column,int row)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  size_t sVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  
  bVar2 = (byte)row & 4;
  pbVar4 = target + 0xd;
  for (sVar5 = 0; length != sVar5; sVar5 = sVar5 + 1) {
    bVar9 = (column + (int)sVar5 & 1U) == 0;
    bVar8 = !bVar9 * '\x03' + 1;
    bVar3 = 8;
    if (bVar9) {
      bVar3 = 2;
    }
    bVar7 = bVar9 * '\x03' + 1;
    bVar1 = 2;
    if (bVar9) {
      bVar1 = 8;
    }
    bVar6 = auxiliary_source[sVar5] >> bVar2 & bVar8;
    pbVar4[-9] = bVar6;
    pbVar4[-0xd] = bVar6;
    bVar6 = auxiliary_source[sVar5] >> bVar2 & bVar3;
    pbVar4[-8] = bVar6;
    pbVar4[-0xc] = bVar6;
    bVar6 = auxiliary_source[sVar5] >> bVar2 & bVar7;
    pbVar4[-7] = bVar6;
    pbVar4[-0xb] = bVar6;
    pbVar4[-10] = auxiliary_source[sVar5] >> bVar2 & bVar1;
    bVar6 = source[sVar5] >> bVar2 & bVar3;
    pbVar4[-1] = bVar6;
    pbVar4[-5] = bVar6;
    bVar7 = source[sVar5] >> bVar2 & bVar7;
    *pbVar4 = bVar7;
    pbVar4[-4] = bVar7;
    pbVar4[-3] = source[sVar5] >> bVar2 & bVar1;
    bVar8 = source[sVar5] >> bVar2 & bVar8;
    pbVar4[-2] = bVar8;
    pbVar4[-6] = bVar8;
    this->graphics_carry_ = source[sVar5] >> bVar2 & bVar3;
    pbVar4 = pbVar4 + 0xe;
  }
  return;
}

Assistant:

void VideoBase::output_double_low_resolution(uint8_t *target, const uint8_t *const source, const uint8_t *const auxiliary_source, size_t length, int column, int row) const {
	const int row_shift = row&4;
	for(size_t c = 0; c < length; ++c) {
		if((column + int(c))&1) {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 4;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 8;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 1;
			target[3] = (auxiliary_source[c] >> row_shift) & 2;

			target[8] = target[12] = (source[c] >> row_shift) & 8;
			target[9] = target[13] = (source[c] >> row_shift) & 1;
			target[10] = (source[c] >> row_shift) & 2;
			target[7] = target[11] = (source[c] >> row_shift) & 4;
			graphics_carry_ = (source[c] >> row_shift) & 8;
		} else {
			target[0] = target[4] = (auxiliary_source[c] >> row_shift) & 1;
			target[1] = target[5] = (auxiliary_source[c] >> row_shift) & 2;
			target[2] = target[6] = (auxiliary_source[c] >> row_shift) & 4;
			target[3] = (auxiliary_source[c] >> row_shift) & 8;

			target[8] = target[12] = (source[c] >> row_shift) & 2;
			target[9] = target[13] = (source[c] >> row_shift) & 4;
			target[10] = (source[c] >> row_shift) & 8;
			target[7] = target[11] = (source[c] >> row_shift) & 1;
			graphics_carry_ = (source[c] >> row_shift) & 2;
		}
		target += 14;
	}
}